

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

dill_reg cg_get_static_block(dill_stream s,cod_code descr)

{
  long in_RSI;
  undefined8 in_RDI;
  dill_reg ret;
  undefined4 local_4;
  
  if (*(int *)(in_RSI + 0x24) == -1) {
    local_4 = dill_getreg(in_RDI,8);
    *(dill_reg *)(in_RSI + 0x24) = local_4;
  }
  else {
    local_4 = *(dill_reg *)(in_RSI + 0x24);
  }
  return local_4;
}

Assistant:

static dill_reg 
cg_get_static_block(dill_stream s, cod_code descr)
{
    dill_reg ret;
    if (descr->static_block_address_register != -1) {
	return descr->static_block_address_register;
    } else {
	ret = dill_getreg(s, DILL_P);
	descr->static_block_address_register = ret;
	return ret;
    }
}